

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O0

VkBufferCreateInfo *
vkt::pipeline::makeBufferCreateInfo
          (VkBufferCreateInfo *__return_storage_ptr__,VkDeviceSize bufferSize,
          VkBufferUsageFlags usage)

{
  VkBufferUsageFlags usage_local;
  VkDeviceSize bufferSize_local;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->size = bufferSize;
  __return_storage_ptr__->usage = usage;
  __return_storage_ptr__->sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  __return_storage_ptr__->queueFamilyIndexCount = 0;
  __return_storage_ptr__->pQueueFamilyIndices = (deUint32 *)0x0;
  return __return_storage_ptr__;
}

Assistant:

VkBufferCreateInfo makeBufferCreateInfo (const VkDeviceSize			bufferSize,
										 const VkBufferUsageFlags	usage)
{
	const VkBufferCreateInfo bufferCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		(VkBufferCreateFlags)0,					// VkBufferCreateFlags	flags;
		bufferSize,								// VkDeviceSize			size;
		usage,									// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
		0u,										// deUint32				queueFamilyIndexCount;
		DE_NULL,								// const deUint32*		pQueueFamilyIndices;
	};
	return bufferCreateInfo;
}